

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O2

char * NCONF_get_string(CONF *conf,char *group,char *name)

{
  CONF_VALUE *pCVar1;
  char *pcVar2;
  CONF_VALUE local_18;
  
  local_18.section = "default";
  if (group != (char *)0x0) {
    local_18.section = group;
  }
  local_18.value = (char *)0x0;
  local_18.name = name;
  pCVar1 = lh_CONF_VALUE_retrieve((lhash_st_CONF_VALUE *)conf->meth,&local_18);
  if (pCVar1 == (CONF_VALUE *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = pCVar1->value;
  }
  return pcVar2;
}

Assistant:

const char *NCONF_get_string(const CONF *conf, const char *section,
                             const char *name) {
  CONF_VALUE templ, *value;

  if (section == NULL) {
    section = kDefaultSectionName;
  }

  OPENSSL_memset(&templ, 0, sizeof(templ));
  templ.section = (char *)section;
  templ.name = (char *)name;
  value = lh_CONF_VALUE_retrieve(conf->values, &templ);
  if (value == NULL) {
    return NULL;
  }
  return value->value;
}